

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codecvt.cpp
# Opt level: O0

void __thiscall
booster::locale::impl_posix::mb2_iconv_converter::mb2_iconv_converter
          (mb2_iconv_converter *this,string *encoding)

{
  char *__tocode;
  char *__fromcode;
  iconv_t __cd;
  undefined8 uVar1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__p;
  string *in_RSI;
  base_converter *in_RDI;
  uint32_t point;
  size_t res;
  size_t outsize;
  char *out;
  uint32_t obuf [2];
  size_t insize;
  char *in;
  char ibuf [2];
  uint c;
  vector<unsigned_int,_std::allocator<unsigned_int>_> first_byte_table;
  iconv_t d;
  char **in_stack_ffffffffffffff08;
  size_t *in_stack_ffffffffffffff10;
  string *in_stack_ffffffffffffff18;
  runtime_error *in_stack_ffffffffffffff20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  uint local_68;
  
  util::base_converter::base_converter(in_RDI);
  in_RDI->_vptr_base_converter = (_func_int **)&PTR__mb2_iconv_converter_002eb428;
  std::shared_ptr<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::shared_ptr
            ((shared_ptr<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)0x28169a);
  __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_RDI + 3);
  std::__cxx11::string::string((string *)__rhs,in_RSI);
  in_RDI[7]._vptr_base_converter = (_func_int **)0xffffffffffffffff;
  in_RDI[8]._vptr_base_converter = (_func_int **)0xffffffffffffffff;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x2816e5);
  __tocode = utf32_encoding();
  __fromcode = (char *)std::__cxx11::string::c_str();
  __cd = iconv_open(__tocode,__fromcode);
  if (__cd != (iconv_t)0xffffffffffffffff) {
    for (local_68 = 0; local_68 < 0x100; local_68 = local_68 + 1) {
      call_iconv(in_stack_ffffffffffffff20,(char **)in_stack_ffffffffffffff18,
                 in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,(size_t *)0x2818e1);
      call_iconv(in_stack_ffffffffffffff20,(char **)in_stack_ffffffffffffff18,
                 in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,(size_t *)0x28195a);
      in_stack_ffffffffffffff20 =
           (runtime_error *)
           call_iconv(in_stack_ffffffffffffff20,(char **)in_stack_ffffffffffffff18,
                      in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,(size_t *)0x281980);
      if (in_stack_ffffffffffffff20 == (runtime_error *)0xffffffffffffffff) {
        __errno_location();
      }
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_ffffffffffffff20,
                 (value_type_conflict3 *)in_stack_ffffffffffffff18);
    }
    iconv_close(__cd);
    __p = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)operator_new(0x18);
    (__p->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__p->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__p->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x281a53);
    std::
    __shared_ptr<std::vector<unsigned_int,std::allocator<unsigned_int>>,(__gnu_cxx::_Lock_policy)2>
    ::reset<std::vector<unsigned_int,std::allocator<unsigned_int>>>
              ((__shared_ptr<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_(__gnu_cxx::_Lock_policy)2>
                *)in_stack_ffffffffffffff20,__p);
    std::
    __shared_ptr_access<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x281a72);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::swap
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_ffffffffffffff20,__p)
    ;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_ffffffffffffff20);
    return;
  }
  uVar1 = __cxa_allocate_exception(0x30);
  std::operator+((char *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),__rhs);
  runtime_error::runtime_error(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  __cxa_throw(uVar1,&runtime_error::typeinfo,runtime_error::~runtime_error);
}

Assistant:

mb2_iconv_converter(std::string const &encoding) :
            encoding_(encoding),
            to_utf_((iconv_t)(-1)),
            from_utf_((iconv_t)(-1))
        {
            iconv_t d = (iconv_t)(-1);
            std::vector<uint32_t> first_byte_table;
            try {
                d = iconv_open(utf32_encoding(),encoding.c_str());
                if(d == (iconv_t)(-1)) {
                    throw booster::runtime_error("Unsupported encoding" + encoding);
                }
                for(unsigned c=0;c<256;c++) {
                    char ibuf[2] = { char(c) , 0 };
                    char *in = ibuf;
                    size_t insize =2;
                    uint32_t obuf[2] = {illegal,illegal};
                    char *out = reinterpret_cast<char *>(obuf);
                    size_t outsize = 8;
                    // Basic sigle codepoint conversion
                    call_iconv(d,&in,&insize,&out,&outsize);
                    if(insize == 0 && outsize == 0 && obuf[1] == 0) {
                        first_byte_table.push_back(obuf[0]);
                        continue;
                    }
                    
                    // Test if this is illegal first byte or incomplete
                    in = ibuf;
                    insize = 1;
                    out = reinterpret_cast<char *>(obuf);
                    outsize = 8;
                    call_iconv(d,0,0,0,0);
                    size_t res = call_iconv(d,&in,&insize,&out,&outsize);
                    
                    // Now if this single byte starts a sequence we add incomplete 
                    // to know to ask that we need two bytes, othewise it may only be
                    // illegal

                    uint32_t point;
                    if(res == (size_t)(-1) && errno == EINVAL)
                        point = incomplete;
                    else
                        point = illegal;
                    first_byte_table.push_back(point);

                }
            }
            catch(...) {
                if(d!=(iconv_t)(-1))
                    iconv_close(d);
                throw;
            }
            iconv_close(d);
            first_byte_table_.reset(new std::vector<uint32_t>());
            first_byte_table_->swap(first_byte_table);
        }